

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.h
# Opt level: O0

int __thiscall
SBPL2DGridSearch::getlowerboundoncostfromstart_inmm(SBPL2DGridSearch *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int h;
  int y_local;
  int x_local;
  SBPL2DGridSearch *this_local;
  int local_4;
  
  iVar2 = x / this->downsample_;
  iVar3 = y / this->downsample_;
  if (this->term_condition_usedlast == SBPL_2DGRIDSEARCH_TERM_CONDITION_OPTPATHFOUND) {
    iVar1 = iVar2 - this->goalX_;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    iVar4 = iVar3 - this->goalY_;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < iVar1) {
      local_30 = iVar2 - this->goalX_;
      if (local_30 < 1) {
        local_30 = -local_30;
      }
    }
    else {
      local_30 = iVar3 - this->goalY_;
      if (local_30 < 1) {
        local_30 = -local_30;
      }
    }
    local_38 = (int)(this->cellSize_m_ * 1000.0 * (float)local_30);
    if ((this->searchStates2D_[iVar2][iVar3].iterationaccessed == this->iteration_) &&
       (this->searchStates2D_[iVar2][iVar3].g + local_38 <= this->largestcomputedoptf_)) {
      local_34 = this->searchStates2D_[iVar2][iVar3].g;
    }
    else {
      if (this->largestcomputedoptf_ < 1000000000) {
        local_38 = this->largestcomputedoptf_ - local_38;
      }
      else {
        local_38 = 1000000000;
      }
      local_34 = local_38;
    }
    local_4 = local_34;
  }
  else {
    if ((this->searchStates2D_[iVar2][iVar3].iterationaccessed == this->iteration_) &&
       (this->searchStates2D_[iVar2][iVar3].g <= this->largestcomputedoptf_)) {
      local_3c = this->searchStates2D_[iVar2][iVar3].g;
    }
    else {
      local_3c = this->largestcomputedoptf_;
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

inline int getlowerboundoncostfromstart_inmm(int x, int y)
    {
        x /= downsample_; // local x
        y /= downsample_; // local y
        if (term_condition_usedlast == SBPL_2DGRIDSEARCH_TERM_CONDITION_OPTPATHFOUND) {
            //heuristic search
            int h = SBPL_2DGRIDSEARCH_HEUR2D(x,y);
            //the logic is that if s wasn't expanded, then g(s) + h(s) >=
            //maxcomputed_fval => g(s) >= maxcomputed_fval - h(s)
            return ((searchStates2D_[x][y].iterationaccessed == iteration_ &&
                    searchStates2D_[x][y].g + h <= largestcomputedoptf_)      ? searchStates2D_[x][y].g :
                    largestcomputedoptf_ < INFINITECOST                       ? largestcomputedoptf_ - h :
                                                                                INFINITECOST);
        }
        else {
            //Dijkstra's search
            //the logic is that if s wasn't expanded, then g(s) >= maxcomputed_fval => g(s) >= maxcomputed_fval - h(s)
            return ((searchStates2D_[x][y].iterationaccessed == iteration_ &&
                    searchStates2D_[x][y].g <= largestcomputedoptf_) ? searchStates2D_[x][y].g :
                    largestcomputedoptf_);
        }
    }